

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::~IfcLightSourcePositional
          (IfcLightSourcePositional *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x50 = 0x8178a0;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x38 = 0x817918;
  this[-1].super_IfcLightSource.AmbientIntensity.ptr = 4.19217862516431e-317;
  this[-1].super_IfcLightSource.Intensity.ptr = 4.19219838779014e-317;
  puVar1 = *(undefined1 **)&this[-1].super_IfcLightSource.field_0x80;
  puVar2 = &this[-1].super_IfcLightSource.field_0x90;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}